

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O0

void __thiscall tcu::DebugOutStreambuf::~DebugOutStreambuf(DebugOutStreambuf *this)

{
  DebugOutStreambuf *this_local;
  
  ~DebugOutStreambuf(this);
  operator_delete(this,0x1b8);
  return;
}

Assistant:

DebugOutStreambuf::~DebugOutStreambuf (void)
{
	if (m_curLine.tellp() != std::streampos(0))
		flushLine();
}